

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_array_scan_state.cpp
# Opt level: O1

ArrowArrayScanState * __thiscall
duckdb::ArrowArrayScanState::GetChild(ArrowArrayScanState *this,idx_t child_idx)

{
  ulong uVar1;
  ArrowScanLocalState *state;
  ClientContext *context;
  pointer pAVar2;
  type pAVar3;
  tuple<duckdb::ArrowArrayScanState_*,_std::default_delete<duckdb::ArrowArrayScanState>_> this_00;
  ulong uVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  _Hash_node_base *p_Var7;
  templated_unique_single_t child_p;
  __uniq_ptr_impl<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>_>
  local_30;
  idx_t local_28;
  
  uVar1 = (this->children)._M_h._M_bucket_count;
  uVar4 = child_idx % uVar1;
  p_Var5 = (this->children)._M_h._M_buckets[uVar4];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var7 = p_Var5->_M_nxt, p_Var6 = p_Var5,
     p_Var5->_M_nxt[1]._M_nxt != (_Hash_node_base *)child_idx)) {
    while (p_Var5 = p_Var7, p_Var7 = p_Var5->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)p_Var7[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var6 = p_Var5, p_Var7[1]._M_nxt == (_Hash_node_base *)child_idx)) goto LAB_01187045;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_01187045:
  if (p_Var6 == (__node_base_ptr)0x0) {
    p_Var7 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var7 = p_Var6->_M_nxt;
  }
  local_28 = child_idx;
  if (p_Var7 == (_Hash_node_base *)0x0) {
    state = this->state;
    context = this->context;
    this_00.
    super__Tuple_impl<0UL,_duckdb::ArrowArrayScanState_*,_std::default_delete<duckdb::ArrowArrayScanState>_>
    .super__Head_base<0UL,_duckdb::ArrowArrayScanState_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_duckdb::ArrowArrayScanState_*,_std::default_delete<duckdb::ArrowArrayScanState>_>
          )operator_new(0x78);
    ArrowArrayScanState((ArrowArrayScanState *)
                        this_00.
                        super__Tuple_impl<0UL,_duckdb::ArrowArrayScanState_*,_std::default_delete<duckdb::ArrowArrayScanState>_>
                        .super__Head_base<0UL,_duckdb::ArrowArrayScanState_*,_false>._M_head_impl,
                        state,context);
    local_30._M_t.
    super__Tuple_impl<0UL,_duckdb::ArrowArrayScanState_*,_std::default_delete<duckdb::ArrowArrayScanState>_>
    .super__Head_base<0UL,_duckdb::ArrowArrayScanState_*,_false>._M_head_impl =
         (tuple<duckdb::ArrowArrayScanState_*,_std::default_delete<duckdb::ArrowArrayScanState>_>)
         (tuple<duckdb::ArrowArrayScanState_*,_std::default_delete<duckdb::ArrowArrayScanState>_>)
         this_00.
         super__Tuple_impl<0UL,_duckdb::ArrowArrayScanState_*,_std::default_delete<duckdb::ArrowArrayScanState>_>
         .super__Head_base<0UL,_duckdb::ArrowArrayScanState_*,_false>._M_head_impl;
    pAVar3 = unique_ptr<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>,_true>
             ::operator*((unique_ptr<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>,_true>
                          *)&local_30);
    shared_ptr<duckdb::ArrowArrayWrapper,_true>::operator=(&pAVar3->owned_data,&this->owned_data);
    ::std::
    _Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::ArrowArrayScanState,std::default_delete<duckdb::ArrowArrayScanState>,true>>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::ArrowArrayScanState,std::default_delete<duckdb::ArrowArrayScanState>,true>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<unsigned_long&,duckdb::unique_ptr<duckdb::ArrowArrayScanState,std::default_delete<duckdb::ArrowArrayScanState>,true>>
              ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::ArrowArrayScanState,std::default_delete<duckdb::ArrowArrayScanState>,true>>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::ArrowArrayScanState,std::default_delete<duckdb::ArrowArrayScanState>,true>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->children,&local_28,&local_30);
    ::std::
    unique_ptr<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>_>::
    ~unique_ptr((unique_ptr<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>_>
                 *)&local_30);
    return pAVar3;
  }
  p_Var7 = p_Var7 + 2;
  pAVar2 = unique_ptr<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>,_true>
           ::operator->((unique_ptr<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>,_true>
                         *)p_Var7);
  if ((pAVar2->owned_data).internal.
      super___shared_ptr<duckdb::ArrowArrayWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    pAVar2 = unique_ptr<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>,_true>
             ::operator->((unique_ptr<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>,_true>
                           *)p_Var7);
    shared_ptr<duckdb::ArrowArrayWrapper,_true>::operator=(&pAVar2->owned_data,&this->owned_data);
  }
  pAVar3 = unique_ptr<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>,_true>
           ::operator*((unique_ptr<duckdb::ArrowArrayScanState,_std::default_delete<duckdb::ArrowArrayScanState>,_true>
                        *)p_Var7);
  return pAVar3;
}

Assistant:

ArrowArrayScanState &ArrowArrayScanState::GetChild(idx_t child_idx) {
	auto it = children.find(child_idx);
	if (it == children.end()) {
		auto child_p = make_uniq<ArrowArrayScanState>(state, context);
		auto &child = *child_p;
		child.owned_data = owned_data;
		children.emplace(child_idx, std::move(child_p));
		return child;
	}
	if (!it->second->owned_data) {
		// Propagate down the ownership, for dictionaries in children
		D_ASSERT(owned_data);
		it->second->owned_data = owned_data;
	}
	return *it->second;
}